

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ParameterDeclarationBaseSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((kind == ParameterDeclaration) || (kind == TypeParameterDeclaration)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ParameterDeclarationBaseSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ParameterDeclaration:
        case SyntaxKind::TypeParameterDeclaration:
            return true;
        default:
            return false;
    }
}